

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  float *pfVar6;
  long lVar7;
  _func_int **pp_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  float *slope;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint _c;
  undefined1 (*pauVar20) [32];
  undefined1 (*pauVar21) [16];
  uint uVar22;
  float fVar23;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar24 [28];
  undefined1 auVar29 [28];
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  Mat local_78;
  
  iVar13 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar13 == 3) {
      uVar22 = bottom_top_blob->h * bottom_top_blob->w;
      uVar19 = 0;
      uVar15 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar15 = uVar19;
      }
      uVar17 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar17 = uVar19;
      }
      for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
        ncnn::Mat::channel(&local_78,bottom_top_blob,(int)uVar19);
        pauVar20 = (undefined1 (*) [32])local_78.data;
        ncnn::Mat::~Mat(&local_78);
        if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
          fVar23 = **(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
          fVar25 = fVar23;
          fVar26 = fVar23;
          fVar27 = fVar23;
        }
        else {
          pfVar6 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]) + uVar19 * 4
          ;
          fVar23 = *pfVar6;
          fVar25 = pfVar6[1];
          fVar26 = pfVar6[2];
          fVar27 = pfVar6[3];
        }
        uVar16 = uVar15;
        while (iVar13 = (int)uVar16, uVar16 = (ulong)(iVar13 - 1), iVar13 != 0) {
          auVar4 = vmaxps_avx(*(undefined1 (*) [16])*pauVar20,ZEXT816(0) << 0x40);
          auVar9 = vminps_avx(*(undefined1 (*) [16])*pauVar20,ZEXT816(0) << 0x40);
          auVar28._0_4_ = auVar9._0_4_ * fVar23 + auVar4._0_4_;
          auVar28._4_4_ = auVar9._4_4_ * fVar25 + auVar4._4_4_;
          auVar28._8_4_ = auVar9._8_4_ * fVar26 + auVar4._8_4_;
          auVar28._12_4_ = auVar9._12_4_ * fVar27 + auVar4._12_4_;
          *(undefined1 (*) [16])*pauVar20 = auVar28;
          pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        }
      }
    }
    else if (iVar13 == 2) {
      pp_Var8 = this->_vptr_PReLU_x86_avx;
      uVar19 = 0;
      uVar15 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar15 = uVar19;
      }
      uVar17 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar17 = uVar19;
      }
      for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
        if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) < 2) {
          fVar23 = **(float **)(&this->field_0xd8 + (long)pp_Var8[-3]);
          fVar25 = fVar23;
          fVar26 = fVar23;
          fVar27 = fVar23;
        }
        else {
          pfVar6 = *(float **)(&this->field_0xd8 + (long)pp_Var8[-3]) + uVar19 * 4;
          fVar23 = *pfVar6;
          fVar25 = pfVar6[1];
          fVar26 = pfVar6[2];
          fVar27 = pfVar6[3];
        }
        pauVar21 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar19 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar16 = uVar15;
        while (iVar13 = (int)uVar16, uVar16 = (ulong)(iVar13 - 1), iVar13 != 0) {
          auVar4 = vmaxps_avx(*pauVar21,ZEXT816(0));
          auVar9 = vminps_avx(*pauVar21,ZEXT816(0));
          auVar32._0_4_ = auVar9._0_4_ * fVar23 + auVar4._0_4_;
          auVar32._4_4_ = auVar9._4_4_ * fVar25 + auVar4._4_4_;
          auVar32._8_4_ = auVar9._8_4_ * fVar26 + auVar4._8_4_;
          auVar32._12_4_ = auVar9._12_4_ * fVar27 + auVar4._12_4_;
          *pauVar21 = auVar32;
          pauVar21 = pauVar21 + 1;
        }
      }
    }
    else if (iVar13 == 1) {
      uVar22 = bottom_top_blob->w;
      pfVar6 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
        fVar23 = *pfVar6;
        uVar19 = 0;
        uVar15 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar15 = uVar19;
        }
        for (; uVar15 * 0x10 != uVar19; uVar19 = uVar19 + 0x10) {
          auVar4 = *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar19);
          auVar9 = vmaxps_avx(auVar4,ZEXT816(0));
          auVar4 = vminps_avx(auVar4,ZEXT816(0));
          pfVar6 = (float *)((long)bottom_top_blob->data + uVar19);
          *pfVar6 = auVar4._0_4_ * fVar23 + auVar9._0_4_;
          pfVar6[1] = auVar4._4_4_ * fVar23 + auVar9._4_4_;
          pfVar6[2] = auVar4._8_4_ * fVar23 + auVar9._8_4_;
          pfVar6[3] = auVar4._12_4_ * fVar23 + auVar9._12_4_;
        }
      }
      else {
        uVar19 = 0;
        uVar15 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar15 = uVar19;
        }
        for (; uVar15 * 0x10 != uVar19; uVar19 = uVar19 + 0x10) {
          auVar4 = *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar19);
          auVar9 = vminps_avx(auVar4,ZEXT816(0));
          pfVar1 = (float *)((long)pfVar6 + uVar19);
          fVar23 = pfVar1[1];
          fVar25 = pfVar1[2];
          fVar26 = pfVar1[3];
          auVar4 = vmaxps_avx(auVar4,ZEXT816(0));
          pfVar2 = (float *)((long)bottom_top_blob->data + uVar19);
          *pfVar2 = auVar9._0_4_ * *pfVar1 + auVar4._0_4_;
          pfVar2[1] = auVar9._4_4_ * fVar23 + auVar4._4_4_;
          pfVar2[2] = auVar9._8_4_ * fVar25 + auVar4._8_4_;
          pfVar2[3] = auVar9._12_4_ * fVar26 + auVar4._12_4_;
        }
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar13 == 3) {
      uVar22 = bottom_top_blob->h * bottom_top_blob->w;
      uVar19 = 0;
      uVar15 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar15 = uVar19;
      }
      uVar17 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar17 = uVar19;
      }
      for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
        ncnn::Mat::channel(&local_78,bottom_top_blob,(int)uVar19);
        pauVar20 = (undefined1 (*) [32])local_78.data;
        ncnn::Mat::~Mat(&local_78);
        if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
          uVar3 = **(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
          auVar24._4_4_ = uVar3;
          auVar24._0_4_ = uVar3;
          auVar24._8_4_ = uVar3;
          auVar24._12_4_ = uVar3;
          auVar24._16_4_ = uVar3;
          auVar24._20_4_ = uVar3;
          auVar24._24_4_ = uVar3;
        }
        else {
          auVar24 = SUB3228(*(undefined1 (*) [32])
                             (*(undefined4 **)
                               (&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]) +
                             uVar19 * 8),0);
        }
        uVar16 = uVar15;
        while (iVar13 = (int)uVar16, uVar16 = (ulong)(iVar13 - 1), iVar13 != 0) {
          auVar5 = vmaxps_avx(*pauVar20,ZEXT1632(ZEXT816(0) << 0x40));
          auVar10 = vminps_avx(*pauVar20,ZEXT1632(ZEXT816(0) << 0x40));
          auVar31._0_4_ = auVar10._0_4_ * auVar24._0_4_ + auVar5._0_4_;
          auVar31._4_4_ = auVar10._4_4_ * auVar24._4_4_ + auVar5._4_4_;
          auVar31._8_4_ = auVar10._8_4_ * auVar24._8_4_ + auVar5._8_4_;
          auVar31._12_4_ = auVar10._12_4_ * auVar24._12_4_ + auVar5._12_4_;
          auVar31._16_4_ = auVar10._16_4_ * auVar24._16_4_ + auVar5._16_4_;
          auVar31._20_4_ = auVar10._20_4_ * auVar24._20_4_ + auVar5._20_4_;
          auVar31._24_4_ = auVar10._24_4_ * auVar24._24_4_ + auVar5._24_4_;
          auVar31._28_4_ = auVar10._28_4_ + auVar5._28_4_;
          *pauVar20 = auVar31;
          pauVar20 = pauVar20 + 1;
        }
      }
    }
    else if (iVar13 == 2) {
      pp_Var8 = this->_vptr_PReLU_x86_avx;
      uVar19 = 0;
      uVar15 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar15 = uVar19;
      }
      uVar17 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar17 = uVar19;
      }
      for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
        if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) < 2) {
          uVar3 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var8[-3]);
          auVar29._4_4_ = uVar3;
          auVar29._0_4_ = uVar3;
          auVar29._8_4_ = uVar3;
          auVar29._12_4_ = uVar3;
          auVar29._16_4_ = uVar3;
          auVar29._20_4_ = uVar3;
          auVar29._24_4_ = uVar3;
        }
        else {
          auVar29 = SUB3228(*(undefined1 (*) [32])
                             (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var8[-3]) + uVar19 * 8),
                            0);
        }
        pauVar20 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar19 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar16 = uVar15;
        while (iVar13 = (int)uVar16, uVar16 = (ulong)(iVar13 - 1), iVar13 != 0) {
          auVar5 = vmaxps_avx(*pauVar20,ZEXT832(0));
          auVar10 = vminps_avx(*pauVar20,ZEXT832(0));
          auVar33._0_4_ = auVar10._0_4_ * auVar29._0_4_ + auVar5._0_4_;
          auVar33._4_4_ = auVar10._4_4_ * auVar29._4_4_ + auVar5._4_4_;
          auVar33._8_4_ = auVar10._8_4_ * auVar29._8_4_ + auVar5._8_4_;
          auVar33._12_4_ = auVar10._12_4_ * auVar29._12_4_ + auVar5._12_4_;
          auVar33._16_4_ = auVar10._16_4_ * auVar29._16_4_ + auVar5._16_4_;
          auVar33._20_4_ = auVar10._20_4_ * auVar29._20_4_ + auVar5._20_4_;
          auVar33._24_4_ = auVar10._24_4_ * auVar29._24_4_ + auVar5._24_4_;
          auVar33._28_4_ = auVar10._28_4_ + auVar5._28_4_;
          *pauVar20 = auVar33;
          pauVar20 = pauVar20 + 1;
        }
      }
    }
    else if (iVar13 == 1) {
      uVar22 = bottom_top_blob->w;
      pfVar6 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
        fVar23 = *pfVar6;
        uVar19 = 0;
        uVar15 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar15 = uVar19;
        }
        for (; uVar15 * 0x20 != uVar19; uVar19 = uVar19 + 0x20) {
          auVar5 = *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar19);
          auVar10 = vmaxps_avx(auVar5,ZEXT832(0));
          auVar5 = vminps_avx(auVar5,ZEXT832(0));
          pfVar6 = (float *)((long)bottom_top_blob->data + uVar19);
          *pfVar6 = auVar5._0_4_ * fVar23 + auVar10._0_4_;
          pfVar6[1] = auVar5._4_4_ * fVar23 + auVar10._4_4_;
          pfVar6[2] = auVar5._8_4_ * fVar23 + auVar10._8_4_;
          pfVar6[3] = auVar5._12_4_ * fVar23 + auVar10._12_4_;
          pfVar6[4] = auVar5._16_4_ * fVar23 + auVar10._16_4_;
          pfVar6[5] = auVar5._20_4_ * fVar23 + auVar10._20_4_;
          pfVar6[6] = auVar5._24_4_ * fVar23 + auVar10._24_4_;
          pfVar6[7] = auVar5._28_4_ + auVar10._28_4_;
        }
      }
      else {
        uVar19 = 0;
        uVar15 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar15 = uVar19;
        }
        for (; uVar15 * 0x20 != uVar19; uVar19 = uVar19 + 0x20) {
          auVar5 = *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar19);
          auVar10 = vminps_avx(auVar5,ZEXT832(0));
          pfVar1 = (float *)((long)pfVar6 + uVar19);
          fVar23 = pfVar1[1];
          fVar25 = pfVar1[2];
          fVar26 = pfVar1[3];
          fVar27 = pfVar1[4];
          fVar11 = pfVar1[5];
          fVar12 = pfVar1[6];
          auVar5 = vmaxps_avx(auVar5,ZEXT832(0));
          pfVar2 = (float *)((long)bottom_top_blob->data + uVar19);
          *pfVar2 = auVar10._0_4_ * *pfVar1 + auVar5._0_4_;
          pfVar2[1] = auVar10._4_4_ * fVar23 + auVar5._4_4_;
          pfVar2[2] = auVar10._8_4_ * fVar25 + auVar5._8_4_;
          pfVar2[3] = auVar10._12_4_ * fVar26 + auVar5._12_4_;
          pfVar2[4] = auVar10._16_4_ * fVar27 + auVar5._16_4_;
          pfVar2[5] = auVar10._20_4_ * fVar11 + auVar5._20_4_;
          pfVar2[6] = auVar10._24_4_ * fVar12 + auVar5._24_4_;
          pfVar2[7] = auVar10._28_4_ + auVar5._28_4_;
        }
      }
    }
  }
  else {
    if (iVar13 != 3) {
      iVar13 = PReLU::forward_inplace
                         ((PReLU *)((long)&this->_vptr_PReLU_x86_avx +
                                   (long)this->_vptr_PReLU_x86_avx[-3]),bottom_top_blob,opt);
      return iVar13;
    }
    uVar22 = bottom_top_blob->c;
    uVar18 = bottom_top_blob->h * bottom_top_blob->w;
    _c = 0;
    if ((int)uVar22 < 1) {
      uVar22 = 0;
    }
    lVar7 = *(long *)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
    for (; _c != uVar22; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar20 = (undefined1 (*) [32])local_78.data;
      ncnn::Mat::~Mat(&local_78);
      uVar15 = 0;
      if (1 < *(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3])) {
        uVar15 = (ulong)_c;
      }
      fVar23 = *(float *)(lVar7 + uVar15 * 4);
      for (iVar13 = (int)uVar18 >> 3; uVar14 = uVar18 & 7, 0 < iVar13; iVar13 = iVar13 + -1) {
        auVar5 = vmaxps_avx(*pauVar20,ZEXT1632(ZEXT816(0) << 0x40));
        auVar10 = vminps_avx(*pauVar20,ZEXT1632(ZEXT816(0) << 0x40));
        auVar30._0_4_ = auVar10._0_4_ * fVar23 + auVar5._0_4_;
        auVar30._4_4_ = auVar10._4_4_ * fVar23 + auVar5._4_4_;
        auVar30._8_4_ = auVar10._8_4_ * fVar23 + auVar5._8_4_;
        auVar30._12_4_ = auVar10._12_4_ * fVar23 + auVar5._12_4_;
        auVar30._16_4_ = auVar10._16_4_ * fVar23 + auVar5._16_4_;
        auVar30._20_4_ = auVar10._20_4_ * fVar23 + auVar5._20_4_;
        auVar30._24_4_ = auVar10._24_4_ * fVar23 + auVar5._24_4_;
        auVar30._28_4_ = auVar10._28_4_ + auVar5._28_4_;
        *pauVar20 = auVar30;
        pauVar20 = pauVar20 + 1;
      }
      for (; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
        if (*(float *)*pauVar20 < 0.0) {
          *(float *)*pauVar20 = *(float *)*pauVar20 * fVar23;
        }
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}